

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::AssembleNew
          (TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZMatrix<double> *stiffness,TPZFMatrix<double> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *pTVar1;
  TPZGuiInterface *this_00;
  TPZCompEl *pTVar2;
  bool bVar3;
  int iVar4;
  int64_t size;
  TPZCompEl **ppTVar5;
  ostream *poVar6;
  long lVar7;
  long nelem;
  TPZFMatrix<double> *rhs_00;
  long lVar8;
  long lVar9;
  int local_87b4;
  TPZVec<int> elorder;
  TPZManVector<long,_10> sourceindex;
  TPZManVector<long,_10> destinationindex;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  
  pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  lVar8 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<double>::TPZElementMatrixT(&ek,pTVar1,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (&ef,(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,EF);
  TPZManVector<long,_10>::TPZManVector(&destinationindex,0);
  TPZManVector<long,_10>::TPZManVector(&sourceindex,0);
  pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  size = TPZCompMesh::NEquations(pTVar1);
  local_87b4 = 0;
  TPZVec<int>::TPZVec(&elorder,size,&local_87b4);
  OrderElement(this);
  lVar9 = 0;
  if (lVar8 < 1) {
    lVar8 = lVar9;
  }
  for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    if ((guiInterface->fRef != (TPZReference *)0x0) &&
       (this_00 = guiInterface->fRef->fPointer, this_00 != (TPZGuiInterface *)0x0)) {
      bVar3 = TPZGuiInterface::AmIKilled(this_00);
      if (bVar3) break;
    }
    nelem = (long)*(int *)(*(long *)&this->field_0xb0 + lVar7 * 4);
    if (-1 < nelem) {
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar2 = *ppTVar5;
      if (pTVar2 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)pTVar2 + 0x108))(pTVar2,&ek,&ef);
        TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
        TPZEquationFilter::Filter
                  (&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fEquationFilter,
                   &ek.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        if (this->f_quiet == 0) {
          if (lVar9 % 0x14 == 0) {
            poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::ostream::_M_insert<long>((long)poVar6);
          }
          std::operator<<((ostream *)&std::cout,'*');
          std::ostream::flush();
        }
        iVar4 = (**(code **)(*(long *)pTVar2 + 0x1f0))(pTVar2);
        if (iVar4 == 0) {
          (*(stiffness->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                    (stiffness,&ek.fMat,&ek.super_TPZElementMatrix.fSourceIndex,
                     &ek.super_TPZElementMatrix.fDestinationIndex);
          rhs_00 = &ef.fMat.super_TPZFMatrix<double>;
        }
        else {
          TPZElementMatrixT<double>::ApplyConstraints(&ek);
          TPZElementMatrixT<double>::ApplyConstraints(&ef);
          (*(stiffness->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                    (stiffness,&ek.fConstrMat,&ek.super_TPZElementMatrix.fSourceIndex,
                     &ek.super_TPZElementMatrix.fDestinationIndex);
          rhs_00 = &ef.fConstrMat.super_TPZFMatrix<double>;
        }
        TPZFMatrix<double>::AddFel
                  (rhs,rhs_00,&ek.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        lVar9 = lVar9 + 1;
      }
    }
  }
  if (this->f_quiet == 0) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  TPZVec<int>::~TPZVec(&elorder);
  TPZManVector<long,_10>::~TPZManVector(&sourceindex);
  TPZManVector<long,_10>::~TPZManVector(&destinationindex);
  TPZElementMatrixT<double>::~TPZElementMatrixT(&ef);
  TPZElementMatrixT<double>::~TPZElementMatrixT(&ek);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleNew(TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
	
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	TPZManVector<int64_t> destinationindex(0);
	TPZManVector<int64_t> sourceindex(0);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	
	for(iel=0; iel < nelem; iel++) {
		
		if(guiInterface) if(guiInterface->AmIKilled()){
			break;
		}
		
		if(fElementOrder[iel] < 0) continue;
		TPZCompEl *el = elementvec[fElementOrder[iel]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
		//ek.fMat->Print(out);
		//ef.fMat->Print();
		if(!f_quiet)
		{
			if(!(numel%20)) cout << endl << numel;
			//    if(!(numel%20)) cout << endl;
			cout << '*';
			cout.flush();
		}
		numel++;
		
		if(!el->HasDependency()) {
			stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);
		}
		else {
			//ek.Print(*this->fMesh,cout);
			ek.ApplyConstraints();
			ef.ApplyConstraints();
			stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			/*
			 if(ek.fConstrMat->Decompose_LU() != -1) {
			 el->ApplyConstraints(ek,ef);
			 ek.Print(*this,check);
			 check.flush();
			 }
			 */
		}
		
	}//fim for iel
	if(!f_quiet)
	{
		cout << endl;
	}
}